

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

void __thiscall
soplex::SLUFactor<double>::solveLeft
          (SLUFactor<double> *this,SSVectorBase<double> *x,SVectorBase<double> *b)

{
  double dVar1;
  int iVar2;
  int iVar3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pdVar4;
  int *piVar5;
  double *vec;
  int *ridx;
  double *rhs;
  int iVar6;
  long lVar7;
  Real eps;
  Real RVar8;
  double dVar9;
  
  this_00 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  eps = Tolerances::epsilon(this_00);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  (*this->solveTime->_vptr_Timer[3])();
  iVar6 = b->memused;
  (this->ssvec).super_IdxSet.num = 0;
  if (0 < (long)iVar6) {
    lVar7 = 0;
    do {
      iVar2 = *(int *)((long)&b->m_elem->idx + lVar7);
      dVar1 = *(double *)((long)&b->m_elem->val + lVar7);
      RVar8 = Tolerances::epsilon((this->ssvec)._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      pdVar4 = (this->ssvec).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      dVar9 = 0.0;
      if (RVar8 < ABS(dVar1)) {
        piVar5 = (this->ssvec).super_IdxSet.idx;
        iVar3 = (this->ssvec).super_IdxSet.num;
        (this->ssvec).super_IdxSet.num = iVar3 + 1;
        piVar5[iVar3] = iVar2;
        dVar9 = dVar1;
      }
      pdVar4[iVar2] = dVar9;
      lVar7 = lVar7 + 0x10;
    } while ((long)iVar6 * 0x10 != lVar7);
  }
  (this->ssvec).setupStatus = true;
  SSVectorBase<double>::clear(x);
  iVar6 = (this->ssvec).super_IdxSet.num;
  piVar5 = (x->super_IdxSet).idx;
  vec = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start;
  x->setupStatus = false;
  ridx = (this->ssvec).super_IdxSet.idx;
  rhs = (this->ssvec).super_VectorBase<double>.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  ;
  (this->ssvec).setupStatus = false;
  iVar6 = CLUFactor<double>::vSolveLeft
                    (&this->super_CLUFactor<double>,eps,vec,piVar5,rhs,ridx,iVar6);
  if (0 < iVar6) {
    x->setupStatus = false;
    (x->super_IdxSet).num = iVar6;
  }
  x->setupStatus = 0 < iVar6;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 1;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(SSVectorBase<R>& x, const SVectorBase<R>& b)  //const
{
   R epsilon = this->tolerances()->epsilon();

   solveTime->start();

   // copy to SSVec is done to avoid having to deal with the Nonzero datatype
   // TODO change SVec to standard sparse format
   ssvec.assign(b);

   x.clear();
   int sz = ssvec.size(); // see .altValues()
   int n = this->vSolveLeft(epsilon, x.altValues(), x.altIndexMem(),
                            ssvec.altValues(), ssvec.altIndexMem(), sz);

   if(n > 0)
   {
      x.setSize(n);
      x.forceSetup();
   }
   else
      x.unSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount++;
   solveTime->stop();
}